

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O2

void Ssw_ClassesPrint(Ssw_Cla_t *p,int fVeryVerbose)

{
  uint uVar1;
  uint uVar2;
  Aig_Obj_t **ppAVar3;
  uint uVar4;
  uint uVar5;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pAVar6;
  int i;
  Ssw_Cla_t *pSVar7;
  Aig_Man_t *pAVar8;
  ulong uVar9;
  
  pSVar7 = p;
  Abc_Print((int)p,"Equiv classes: Const1 = %5d. Class = %5d. Lit = %5d.\n",(ulong)(uint)p->nCands1,
            (ulong)(uint)p->nClasses,(ulong)(uint)(p->nLits + p->nCands1));
  if (fVeryVerbose != 0) {
    Abc_Print((int)pSVar7,"Constants { ");
    for (i = 0; pSVar7 = (Ssw_Cla_t *)p->pAig->vObjs, i < *(int *)((long)&pSVar7->pAig + 4);
        i = i + 1) {
      pObj = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pSVar7,i);
      if (pObj != (Aig_Obj_t *)0x0) {
        pAVar8 = p->pAig;
        if (pAVar8->pReprs == (Aig_Obj_t **)0x0) {
          pAVar6 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar6 = pAVar8->pReprs[pObj->Id];
        }
        if (pAVar6 == pAVar8->pConst1) {
          uVar1 = pObj->Id;
          uVar2 = *(uint *)&pObj->field_0x1c;
          uVar4 = Aig_SupportSize(pAVar8,pObj);
          pAVar8 = p->pAig;
          uVar5 = Aig_NodeMffcSupp(pAVar8,pObj,0,(Vec_Ptr_t *)0x0);
          Abc_Print((int)pAVar8,"%d(%d,%d,%d) ",(ulong)uVar1,(ulong)(uVar2 & 0xffffff),(ulong)uVar4,
                    (ulong)uVar5);
        }
      }
    }
    Abc_Print((int)pSVar7,"}\n");
    for (uVar9 = 0; (long)uVar9 < (long)p->pAig->vObjs->nSize; uVar9 = uVar9 + 1) {
      ppAVar3 = p->pId2Class[uVar9];
      if (ppAVar3 != (Aig_Obj_t **)0x0) {
        Abc_Print((int)pSVar7,"%3d (%3d) : ",uVar9 & 0xffffffff,(ulong)(uint)p->pClassSizes[uVar9]);
        pSVar7 = p;
        Ssw_ClassesPrintOne(p,*ppAVar3);
      }
    }
    Abc_Print((int)pSVar7,"\n");
    return;
  }
  return;
}

Assistant:

void Ssw_ClassesPrint( Ssw_Cla_t * p, int fVeryVerbose )
{
    Aig_Obj_t ** ppClass;
    Aig_Obj_t * pObj;
    int i;
    Abc_Print( 1, "Equiv classes: Const1 = %5d. Class = %5d. Lit = %5d.\n",
        p->nCands1, p->nClasses, p->nCands1+p->nLits );
    if ( !fVeryVerbose )
        return;
    Abc_Print( 1, "Constants { " );
    Aig_ManForEachObj( p->pAig, pObj, i )
        if ( Ssw_ObjIsConst1Cand( p->pAig, pObj ) )
            Abc_Print( 1, "%d(%d,%d,%d) ", pObj->Id, pObj->Level,
            Aig_SupportSize(p->pAig,pObj), Aig_NodeMffcSupp(p->pAig,pObj,0,NULL) );
    Abc_Print( 1, "}\n" );
    Ssw_ManForEachClass( p, ppClass, i )
    {
        Abc_Print( 1, "%3d (%3d) : ", i, p->pClassSizes[i] );
        Ssw_ClassesPrintOne( p, ppClass[0] );
    }
    Abc_Print( 1, "\n" );
}